

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  wasm_functype_t *pwVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 local_b8 [8];
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  wasm_func_t *run_func;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_vec_t imports;
  wasm_extern_t *externs [1];
  wasm_func_t *hello_func;
  wasm_functype_t *hello_type;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("hello.wasm","rb");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Validating module...\n");
      uVar4 = wasm_module_validate(uVar2,&module);
      if ((uVar4 & 1) == 0) {
        printf("> Error validating module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        printf("Compiling module...\n");
        lVar5 = wasm_module_new(uVar2,&module);
        if (lVar5 == 0) {
          printf("> Error compiling module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          wasm_byte_vec_delete(&module);
          printf("Creating callback...\n");
          pwVar6 = wasm_functype_new_0_0();
          uVar7 = wasm_func_new(uVar2,pwVar6,hello_callback);
          wasm_functype_delete(pwVar6);
          printf("Instantiating module...\n");
          imports.data = (wasm_extern_t **)wasm_func_as_extern(uVar7);
          instance = (wasm_instance_t *)0x1;
          imports.size = (size_t)&imports.data;
          exports.data = (wasm_extern_t **)wasm_instance_new(uVar2,lVar5,&instance,0);
          if (exports.data == (wasm_extern_t **)0x0) {
            printf("> Error instantiating module!\n");
            argv_local._4_4_ = 1;
          }
          else {
            wasm_func_delete(uVar7);
            printf("Extracting export...\n");
            wasm_instance_exports(exports.data);
            if (run_func == (wasm_func_t *)0x0) {
              printf("> Error accessing exports!\n");
              argv_local._4_4_ = 1;
            }
            else {
              lVar8 = wasm_extern_as_func(*(undefined8 *)exports.size);
              if (lVar8 == 0) {
                printf("> Error accessing export!\n");
                argv_local._4_4_ = 1;
              }
              else {
                wasm_module_delete(lVar5);
                wasm_instance_delete(exports.data);
                printf("Calling export...\n");
                memset(&results.data,0,0x10);
                memset(local_b8,0,0x10);
                lVar5 = wasm_func_call(lVar8,&results.data,local_b8);
                if (lVar5 == 0) {
                  wasm_extern_vec_delete(&run_func);
                  printf("Shutting down...\n");
                  wasm_store_delete(uVar2);
                  wasm_engine_delete(uVar1);
                  printf("Done.\n");
                  argv_local._4_4_ = 0;
                }
                else {
                  printf("> Error calling function!\n");
                  argv_local._4_4_ = 1;
                }
              }
            }
          }
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("hello.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Validate.
  printf("Validating module...\n");
  if (!wasm_module_validate(store, &binary)) {
    printf("> Error validating module!\n");
    return 1;
  }

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* hello_type = wasm_functype_new_0_0();
  own wasm_func_t* hello_func =
    wasm_func_new(store, hello_type, hello_callback);

  wasm_functype_delete(hello_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(hello_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(hello_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_vec_t args = WASM_EMPTY_VEC;
  wasm_val_vec_t results = WASM_EMPTY_VEC;
  if (wasm_func_call(run_func, &args, &results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}